

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRHS.cpp
# Opt level: O0

void __thiscall
HDualRHS::update_weight(HDualRHS *this,HVector *column,double devex,double Kai,double *dseArray)

{
  double dVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  double in_XMM0_Qa;
  double dVar7;
  double in_XMM1_Qa;
  double val_1;
  int iRow_1;
  int i;
  double val;
  int iRow;
  bool updateWeight_inDense;
  double *columnArray;
  int *columnIndex;
  int columnCount;
  int numRow;
  int in_stack_ffffffffffffff6c;
  HTimer *in_stack_ffffffffffffff70;
  int local_54;
  int local_48;
  
  HTimer::recordStart(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  iVar3 = HModel::getNumRow((HModel *)*in_RDI);
  iVar2 = *(int *)(in_RSI + 4);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),0);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),0);
  if (-1 < iVar2 && (double)iVar2 <= (double)iVar3 * 0.4) {
    for (local_54 = 0; local_54 < iVar2; local_54 = local_54 + 1) {
      iVar3 = pvVar4[local_54];
      in_stack_ffffffffffffff70 = (HTimer *)pvVar5[iVar3];
      dVar1 = *(double *)(in_RDX + (long)iVar3 * 8);
      dVar7 = in_XMM0_Qa * (double)in_stack_ffffffffffffff70;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),(long)iVar3);
      *pvVar6 = (double)in_stack_ffffffffffffff70 * (dVar7 + in_XMM1_Qa * dVar1) + *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),(long)iVar3);
      if (*pvVar6 <= 0.0001 && *pvVar6 != 0.0001) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),(long)iVar3);
        *pvVar6 = 0.0001;
      }
    }
  }
  else {
    for (local_48 = 0; local_48 < iVar3; local_48 = local_48 + 1) {
      dVar1 = pvVar5[local_48];
      dVar7 = *(double *)(in_RDX + (long)local_48 * 8);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),(long)local_48);
      *pvVar6 = dVar1 * (in_XMM0_Qa * dVar1 + in_XMM1_Qa * dVar7) + *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),(long)local_48);
      if (*pvVar6 <= 0.0001 && *pvVar6 != 0.0001) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc),(long)local_48
                           );
        *pvVar6 = 0.0001;
      }
    }
  }
  HTimer::recordFinish(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  return;
}

Assistant:

void HDualRHS::update_weight(HVector *column, double devex, double Kai,
        double *dseArray) {
    workModel->timer.recordStart(HTICK_UPDATE_WEIGHT);

    const int numRow = workModel->getNumRow();
    const int columnCount = column->count;
    const int *columnIndex = &column->index[0];
    const double *columnArray = &column->array[0];

    bool updateWeight_inDense = columnCount < 0 || columnCount > 0.4 * numRow;
    if (updateWeight_inDense) {
        for (int iRow = 0; iRow < numRow; iRow++) {
            const double val = columnArray[iRow];
            workEdWt[iRow] += val * (devex * val + Kai * dseArray[iRow]);
            if (workEdWt[iRow] < 1e-4)
                workEdWt[iRow] = 1e-4;
        }
    } else {
        for (int i = 0; i < columnCount; i++) {
            const int iRow = columnIndex[i];
            const double val = columnArray[iRow];
            workEdWt[iRow] += val * (devex * val + Kai * dseArray[iRow]);
            if (workEdWt[iRow] < 1e-4)
                workEdWt[iRow] = 1e-4;
        }
    }
    workModel->timer.recordFinish(HTICK_UPDATE_WEIGHT);
}